

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O2

void mergesort_3way(uchar **strings,size_t n,uchar **tmp)

{
  ulong n_00;
  ulong uVar1;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,(size_t)tmp);
    return;
  }
  n_00 = n / 3;
  uVar1 = (n * 2) / 3;
  mergesort_3way(strings,n_00,tmp);
  mergesort_3way(strings + n_00,uVar1 - n_00,tmp);
  mergesort_3way(strings + uVar1,n - uVar1,tmp);
  merge_3way(strings,n_00,strings + n_00,uVar1 - n_00,strings + uVar1,n - uVar1,tmp);
  memcpy(strings,tmp,n << 3);
  return;
}

Assistant:

static void
mergesort_3way(unsigned char** strings, size_t n, unsigned char** tmp)
{
	debug() << __func__ << "(), n="<<n<<"\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	const size_t split0 = n/3, split1 = (2*n)/3;
	mergesort_3way(strings,        split0,        tmp);
	mergesort_3way(strings+split0, split1-split0, tmp);
	mergesort_3way(strings+split1, n-split1,      tmp);
	merge_3way(strings, split0,
	           strings+split0, split1-split0,
	           strings+split1, n-split1,
	           tmp);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}